

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

result_type __thiscall
WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_32UL,_0UL,_3UL,_24UL,_10UL,_boost::random::detail::M1,_boost::random::detail::M3<8>,_boost::random::detail::M3<-19>,_boost::random::detail::M3<-14>,_boost::random::detail::M3<-11>,_boost::random::detail::M3<-7>,_boost::random::detail::M3<-13>,_boost::random::detail::M0,_boost::random::detail::no_tempering>,_3498005132U>
::generate(WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_32UL,_0UL,_3UL,_24UL,_10UL,_boost::random::detail::M1,_boost::random::detail::M3<8>,_boost::random::detail::M3<_19>,_boost::random::detail::M3<_14>,_boost::random::detail::M3<_11>,_boost::random::detail::M3<_7>,_boost::random::detail::M3<_13>,_boost::random::detail::M0,_boost::random::detail::no_tempering>,_3498005132U>
           *this)

{
  result_type rVar1;
  long lVar2;
  uint uVar3;
  uint *p;
  uint state [32];
  uint *local_a0;
  uint local_98 [2];
  undefined8 auStack_90 [15];
  uint local_18 [2];
  
  lVar2 = 0;
  do {
    *(undefined8 *)((long)auStack_90 + lVar2 * 4 + -8) = 0x100000001;
    *(undefined8 *)((long)auStack_90 + lVar2 * 4) = 0x100000001;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x20);
  local_a0 = local_98;
  boost::random::
  well_engine<unsigned_int,32ul,32ul,0ul,3ul,24ul,10ul,boost::random::detail::M1,boost::random::detail::M3<8>,boost::random::detail::M3<-19>,boost::random::detail::M3<-14>,boost::random::detail::M3<-11>,boost::random::detail::M3<-7>,boost::random::detail::M3<-13>,boost::random::detail::M0,boost::random::detail::no_tempering>
  ::seed<unsigned_int*>
            ((well_engine<unsigned_int,32ul,32ul,0ul,3ul,24ul,10ul,boost::random::detail::M1,boost::random::detail::M3<8>,boost::random::detail::M3<_19>,boost::random::detail::M3<_14>,boost::random::detail::M3<_11>,boost::random::detail::M3<_7>,boost::random::detail::M3<_13>,boost::random::detail::M0,boost::random::detail::no_tempering>
              *)this,&local_a0,local_18);
  uVar3 = 0x3b9aca01;
  do {
    rVar1 = boost::random::
            well_engine<unsigned_int,_32UL,_32UL,_0UL,_3UL,_24UL,_10UL,_boost::random::detail::M1,_boost::random::detail::M3<8>,_boost::random::detail::M3<-19>,_boost::random::detail::M3<-14>,_boost::random::detail::M3<-11>,_boost::random::detail::M3<-7>,_boost::random::detail::M3<-13>,_boost::random::detail::M0,_boost::random::detail::no_tempering>
            ::operator()(&this->rng);
    uVar3 = uVar3 - 1;
  } while (1 < uVar3);
  return rVar1;
}

Assistant:

result_type generate()
    {
        unsigned state[RandomNumberGenerator::state_size];
        std::uninitialized_fill_n(state, boost::size(state), 1);

        unsigned* p = state;
        rng.seed(p, boost::end(state));

        result_type x;

        int iterations = 1000000000;

        while (iterations-- > 0)
            x = rng();

        return x;
    }